

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O1

void re2c::prtHex(ostream *o,uint32_t c)

{
  type_t tVar1;
  undefined8 in_RAX;
  opt_t *poVar2;
  ostream *poVar3;
  undefined8 local_28;
  
  local_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(o,"0x",2);
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  tVar1 = (poVar2->encoding).type_;
  if ((0x10U >> ((byte)tVar1 & 0x1f) & 1) != 0 || UTF8 < tVar1) {
    local_28 = CONCAT71(local_28._1_7_,"0123456789ABCDEF"[c >> 0x1c]);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_28,1);
    local_28._0_2_ = CONCAT11("0123456789ABCDEF"[c >> 0x18 & 0xf],(char)local_28);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)((long)&local_28 + 1),1);
    local_28._0_3_ = CONCAT12("0123456789ABCDEF"[c >> 0x14 & 0xf],(undefined2)local_28);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)((long)&local_28 + 2),1);
    local_28._0_4_ = CONCAT13("0123456789ABCDEF"[c >> 0x10 & 0xf],(undefined3)local_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&local_28 + 3),1);
  }
  if ((0x1cU >> ((byte)tVar1 & 0x1f) & 1) != 0 || UTF8 < tVar1) {
    local_28._0_5_ = CONCAT14("0123456789ABCDEF"[c >> 0xc & 0xf],(undefined4)local_28);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)((long)&local_28 + 4),1);
    local_28._0_6_ = CONCAT15("0123456789ABCDEF"[c >> 8 & 0xf],(undefined5)local_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&local_28 + 5),1);
  }
  local_28._0_7_ = CONCAT16("0123456789ABCDEF"[c >> 4 & 0xf],(undefined6)local_28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)((long)&local_28 + 6),1);
  local_28 = CONCAT17("0123456789ABCDEF"[c & 0xf],(undefined7)local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&local_28 + 7),1);
  return;
}

Assistant:

void prtHex(std::ostream& o, uint32_t c)
{
	o << "0x";
	const uint32_t cunit_size = opts->encoding.szCodeUnit ();
	if (cunit_size >= 4)
	{
		o << hexCh (c >> 28u)
			<< hexCh (c >> 24u)
			<< hexCh (c >> 20u)
			<< hexCh (c >> 16u);
	}
	if (cunit_size >= 2)
	{
		o << hexCh (c >> 12u)
			<< hexCh (c >> 8u);
	}
	o << hexCh (c >> 4u)
		<< hexCh (c);
}